

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::mousePressEvent(QMenu *this,QMouseEvent *e)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  QPoint this_00;
  undefined8 in_RSI;
  QMenuPrivate *in_RDI;
  long in_FS_OFFSET;
  QPointF QVar4;
  QAction *action;
  QMenuPrivate *d;
  QWidget *in_stack_fffffffffffffee8;
  QWidget *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  QPoint in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0f;
  QMenuPrivate *in_stack_ffffffffffffff18;
  QPoint QVar5;
  undefined1 activateFirst;
  QMenuPrivate *pQVar6;
  QMenuPrivate *this_01;
  undefined1 in_stack_ffffffffffffff50 [16];
  undefined1 auVar7 [13];
  QPoint local_a0;
  QSize local_98;
  QPoint local_88;
  undefined1 local_80 [8];
  QAction *in_stack_ffffffffffffff88;
  QPoint local_48;
  undefined1 in_stack_ffffffffffffffc0 [16];
  
  auVar7 = in_stack_ffffffffffffff50._3_13_;
  activateFirst = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = in_RDI;
  this_00 = (QPoint)d_func((QMenu *)0x64ac15);
  if (((*(ushort *)((long)this_00 + 0x420) >> 8 & 1) != 0) ||
     (bVar2 = QMenuPrivate::mouseEventTaken
                        (in_stack_ffffffffffffffc0._8_8_,in_stack_ffffffffffffffc0._0_8_), bVar2))
  goto LAB_0064af3a;
  QSinglePointEvent::position((QSinglePointEvent *)0x64ac58);
  QPointF::toPoint((QPointF *)in_stack_ffffffffffffff00);
  bVar2 = QPoint::isNull((QPoint *)in_stack_ffffffffffffff00);
  if (bVar2) {
    QSinglePointEvent::globalPosition((QSinglePointEvent *)0x64ac9c);
    bVar2 = QPointF::isNull((QPointF *)in_stack_fffffffffffffef0);
    in_stack_ffffffffffffff0f = 1;
    if (bVar2) goto LAB_0064accd;
  }
  else {
LAB_0064accd:
    QWidget::rect((QWidget *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08));
    QSinglePointEvent::position((QSinglePointEvent *)0x64acf1);
    local_48 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff00);
    bVar3 = QRect::contains((QPoint *)&stack0xffffffffffffffc0,SUB81(&local_48,0));
    in_stack_ffffffffffffff0f = 1;
    if ((bVar3 & 1) != 0) {
      QVar5 = this_00;
      QSinglePointEvent::globalPosition((QSinglePointEvent *)0x64ad52);
      QPointF::toPoint((QPointF *)this_00);
      bVar2 = QMenuPrivate::hasMouseMoved(in_stack_ffffffffffffff18,(QPoint *)in_RDI);
      in_stack_ffffffffffffff0f = bVar2 ^ 0xff;
      in_stack_ffffffffffffff00 = this_00;
      this_00 = QVar5;
    }
  }
  if ((in_stack_ffffffffffffff0f & 1) == 0) {
    QMenuPrivate::mouseDown = (QMenu *)in_RDI;
    QVar5 = this_00;
    QVar4 = QSinglePointEvent::position((QSinglePointEvent *)0x64aee6);
    this_01 = (QMenuPrivate *)QVar4.xp;
    QPointF::toPoint((QPointF *)in_stack_ffffffffffffff00);
    QMenuPrivate::actionAt
              ((QMenuPrivate *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),QVar5);
    QMenuPrivate::setCurrentAction
              (this_01,in_stack_ffffffffffffff88,(int)((ulong)pQVar6 >> 0x20),
               (SelectionReason)pQVar6,(bool)activateFirst);
    QWidget::update((QWidget *)this_00);
  }
  else {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x64adaf);
    bVar3 = 0;
    if (bVar2) {
      in_stack_fffffffffffffef0 = QPointer<QWidget>::operator->((QPointer<QWidget> *)0x64add2);
      QPoint::QPoint((QPoint *)in_stack_fffffffffffffef0);
      local_88 = QWidget::mapToGlobal
                           ((QWidget *)in_stack_ffffffffffffff00,
                            (QPoint *)CONCAT17(bVar3,in_stack_fffffffffffffef8));
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x64ae0f);
      local_98 = QWidget::size(in_stack_fffffffffffffee8);
      QRect::QRect((QRect *)in_RDI,
                   (QPoint *)CONCAT17(in_stack_ffffffffffffff0f,in_stack_ffffffffffffff08),
                   (QSize *)in_stack_ffffffffffffff00);
      QVar4 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x64ae46);
      auVar7 = QVar4._3_13_;
      local_a0 = QPointF::toPoint((QPointF *)in_stack_ffffffffffffff00);
      bVar3 = QRect::contains((QPoint *)local_80,SUB81(&local_a0,0));
    }
    if ((bVar3 & 1) != 0) {
      QWidget::setAttribute(auVar7._5_8_,auVar7._1_4_,auVar7[0]);
    }
    if (*(QEventLoop **)((long)this_00 + 0x2b0) != (QEventLoop *)0x0) {
      QPointer<QAction>::operator=
                ((QPointer<QAction> *)in_stack_fffffffffffffef0,(QAction *)in_stack_fffffffffffffee8
                );
    }
    QMenuPrivate::hideUpToMenuBar(in_RDI);
  }
LAB_0064af3a:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::mousePressEvent(QMouseEvent *e)
{
    Q_D(QMenu);
    if (d->aboutToHide || d->mouseEventTaken(e))
        return;
    // Workaround for XCB on multiple screens which doesn't have offset. If the menu is open on one screen
    // and mouse clicks on second screen, e->pos() is QPoint(0,0) and the menu doesn't hide. This trick makes
    // possible to hide the menu when mouse clicks on another screen (e->screenPos() returns correct value).
    // Only when mouse clicks in QPoint(0,0) on second screen, the menu doesn't hide.
    if ((e->position().toPoint().isNull() && !e->globalPosition().isNull())
        || !rect().contains(e->position().toPoint())
        || !d->hasMouseMoved(e->globalPosition().toPoint())) {
         if (d->noReplayFor
             && QRect(d->noReplayFor->mapToGlobal(QPoint()), d->noReplayFor->size()).contains(e->globalPosition().toPoint()))
             setAttribute(Qt::WA_NoMouseReplay);
         if (d->eventLoop) // synchronous operation
             d->syncAction = nullptr;
        d->hideUpToMenuBar();
        return;
    }
    QMenuPrivate::mouseDown = this;

    QAction *action = d->actionAt(e->position().toPoint());
    d->setCurrentAction(action, 20);
    update();
}